

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O1

uint8_t * __thiscall
Lodtalk::MethodAssembler::PushTemporal::encode(PushTemporal *this,uint8_t *buffer)

{
  if (this->index < 0xc) {
    *buffer = (char)this->index + '@';
    return buffer + 1;
  }
  *buffer = 0xe5;
  buffer[1] = (uint8_t)this->index;
  return buffer + 2;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(index < 12)
		{
			*buffer++ = uint8_t(BytecodeSet::PushTempShortFirst + index);
			return buffer;
		}

		*buffer++ = BytecodeSet::PushTemporary;
		*buffer++ = (uint8_t)index;
		return buffer;
	}